

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

void __thiscall
TwoValuesWithHashCollision_LeafLevelTenCollision_Test::TestBody
          (TwoValuesWithHashCollision_LeafLevelTenCollision_Test *this)

{
  database *db;
  test_trie *ptVar1;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar2;
  uint generation;
  index_pointer *piVar3;
  index_pointer iVar4;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr_2;
  pointer *__ptr;
  internal_node *piVar6;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  shared_ptr<const_pstore::index::details::internal_node> level1_internal;
  AssertionResult gtest_ar__2;
  shared_ptr<const_pstore::index::details::internal_node> level2_internal;
  shared_ptr<const_pstore::index::details::internal_node> level6_internal;
  shared_ptr<const_pstore::index::details::internal_node> level7_internal;
  shared_ptr<const_pstore::index::details::internal_node> level10_internal;
  shared_ptr<const_pstore::index::details::internal_node> level5_internal;
  shared_ptr<const_pstore::index::details::internal_node> level9_internal;
  shared_ptr<const_pstore::index::details::internal_node> level8_internal;
  shared_ptr<const_pstore::index::details::internal_node> level4_internal;
  shared_ptr<const_pstore::index::details::internal_node> level3_internal;
  transaction_type t1;
  undefined1 local_338 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  undefined1 local_318 [8];
  index_pointer local_310;
  index_pointer local_308;
  undefined1 local_300 [16];
  index_pointer local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  AssertHelper local_2e0;
  undefined1 local_2d8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  index_pointer local_2b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b0;
  index_pointer local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  undefined1 local_298 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  undefined1 local_278 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_260;
  undefined1 local_258 [16];
  transaction<std::unique_lock<mock_mutex>_> local_248;
  undefined1 local_210 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_128;
  undefined1 local_118 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_30;
  
  db = &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.db_;
  local_338 = (undefined1  [8])
              &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture
               .field_0x10;
  local_330[0] = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_338);
  local_330[0] = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)(local_258 + 0x10),db,
             (lock_type *)local_338);
  if ((local_330[0] ==
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x1) && (local_338 != (undefined1  [8])0x0)) {
    local_330[0] = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )0x0;
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_338 = (undefined1  [8])&local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"e","");
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_118,ptVar1,(transaction_type *)(local_258 + 0x10),(string *)local_338);
  if (local_30._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_30,local_30._M_head_impl);
  }
  local_30._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if (local_338 != (undefined1  [8])&local_328) {
    operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_338 = (undefined1  [8])&local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"f","");
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_210,ptVar1,(transaction_type *)(local_258 + 0x10),(string *)local_338);
  if ((_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )local_128._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_128,local_128._M_head_impl);
  }
  local_128._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if (local_338 != (undefined1  [8])&local_328) {
    operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_338 = (undefined1  [8])&local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"e","");
  bVar2 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,ptVar1,(string *)local_338);
  local_318[0] = (internal)bVar2;
  local_310.internal_ = (internal_node *)0x0;
  if (local_338 != (undefined1  [8])&local_328) {
    operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_300._4_4_,local_300._0_4_) + 0x10),
               "key \"e\" should be present in the index",0x26);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_338,(internal *)local_318,
               (AssertionResult *)"this->is_found (*index_, \"e\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3dd,(char *)local_338);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d8,(Message *)local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d8);
    if (local_338 != (undefined1  [8])&local_328) {
      operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_300._4_4_,local_300._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_300._4_4_,local_300._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_318 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_310.internal_);
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_338 = (undefined1  [8])&local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"f","");
  bVar2 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,ptVar1,(string *)local_338);
  local_318[0] = (internal)bVar2;
  local_310.internal_ = (internal_node *)0x0;
  if (local_338 != (undefined1  [8])&local_328) {
    operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_300._4_4_,local_300._0_4_) + 0x10),
               "key \"f\" should be present in the index",0x26);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_338,(internal *)local_318,
               (AssertionResult *)"this->is_found (*index_, \"f\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3de,(char *)local_338);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d8,(Message *)local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d8);
    if (local_338 != (undefined1  [8])&local_328) {
      operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_300._4_4_,local_300._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_300._4_4_,local_300._0_4_) + 8))();
    }
  }
  iVar4 = local_310;
  if (local_310.internal_ != (internal_node *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_318 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_310.internal_);
  }
  piVar6 = (((this->super_TwoValuesWithHashCollision).index_._M_t.
             super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .
             super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
            ._M_head_impl)->root_).internal_;
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_heap_internal_node
            ((GenericIndexFixture *)piVar6,iVar4);
  piVar6 = (internal_node *)((ulong)piVar6 & 0xfffffffffffffffc);
  local_318 = (undefined1  [8])piVar6->bitmap_;
  local_300._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_338,"root_internal->get_bitmap ()","0b1U",(unsigned_long *)local_318,
             (uint *)local_300);
  if (local_338[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)CONCAT71(local_330._1_7_,local_330[0]) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_330._1_7_,local_330[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3e4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_300,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_300);
    if ((_Type)local_318 != (_Type)0x0) {
      (**(code **)(*(long *)local_318 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_330._1_7_,local_330[0]) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_330._1_7_,local_330[0]));
  }
  piVar3 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar6 = piVar3->internal_;
  local_318 = (undefined1  [8])((internal_node *)((ulong)piVar6 & 0xfffffffffffffffc))->bitmap_;
  local_300._0_4_ = 0x20;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_338,"level5_internal->get_bitmap ()","0b100000U",
             (unsigned_long *)local_318,(uint *)local_300);
  if (local_338[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)CONCAT71(local_330._1_7_,local_330[0]) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_330._1_7_,local_330[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3eb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_300,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_300);
    if ((_Type)local_318 != (_Type)0x0) {
      (**(code **)(*(long *)local_318 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_330._1_7_,local_330[0]) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_330._1_7_,local_330[0]));
  }
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar6 & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar6 = (internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc);
  local_318 = (undefined1  [8])piVar6->bitmap_;
  local_300._0_4_ = 0x9000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_338,"level10_internal->get_bitmap ()","0b1001000000000000U",
             (unsigned_long *)local_318,(uint *)local_300);
  if (local_338[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)CONCAT71(local_330._1_7_,local_330[0]) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_330._1_7_,local_330[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3f2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_300,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_300);
    if ((_Type)local_318 != (_Type)0x0) {
      (**(code **)(*(long *)local_318 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_330._1_7_,local_330[0]) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_330._1_7_,local_330[0]));
  }
  iVar4.internal_ = (internal_node *)0x0;
  piVar3 = pstore::index::details::internal_node::operator[](piVar6,0);
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)piVar3->internal_,iVar4);
  iVar4 = (index_pointer)0x1;
  piVar3 = pstore::index::details::internal_node::operator[](piVar6,1);
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)piVar3->internal_,iVar4);
  this_00 = (this->super_TwoValuesWithHashCollision).index_._M_t.
            super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
            ._M_head_impl;
  generation = pstore::database::get_current_revision(db);
  iVar4.internal_ = (internal_node *)(local_258 + 0x10);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flush(this_00,(transaction_base *)iVar4.internal_,generation);
  piVar6 = (((this->super_TwoValuesWithHashCollision).index_._M_t.
             super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .
             super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
            ._M_head_impl)->root_).internal_;
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)piVar6,iVar4);
  if (((ulong)piVar6 & 2) == 0) {
    pstore::index::details::internal_node::read_node
              ((internal_node *)local_318,db,
               (typed_address<pstore::index::details::internal_node>)
               ((ulong)piVar6 & 0xfffffffffffffffc));
    piVar3 = pstore::index::details::internal_node::operator[]((internal_node *)local_318,0);
    if (((ulong)piVar3->internal_ & 2) == 0) {
      pstore::index::details::internal_node::read_node
                ((internal_node *)local_300,db,
                 (typed_address<pstore::index::details::internal_node>)
                 ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
      piVar3 = pstore::index::details::internal_node::operator[]
                         ((internal_node *)CONCAT44(local_300._4_4_,local_300._0_4_),0);
      if (((ulong)piVar3->internal_ & 2) == 0) {
        pstore::index::details::internal_node::read_node
                  ((internal_node *)local_2d8,db,
                   (typed_address<pstore::index::details::internal_node>)
                   ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
        piVar3 = pstore::index::details::internal_node::operator[]
                           ((internal_node *)local_2d8._0_8_,0);
        if (((ulong)piVar3->internal_ & 2) == 0) {
          pstore::index::details::internal_node::read_node
                    ((internal_node *)local_258,db,
                     (typed_address<pstore::index::details::internal_node>)
                     ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
          piVar3 = pstore::index::details::internal_node::operator[]
                             ((internal_node *)local_258._0_8_,0);
          if (((ulong)piVar3->internal_ & 2) == 0) {
            pstore::index::details::internal_node::read_node
                      ((internal_node *)(local_278 + 0x10),db,
                       (typed_address<pstore::index::details::internal_node>)
                       ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
            piVar3 = pstore::index::details::internal_node::operator[]
                               ((internal_node *)local_278._16_8_,0);
            if (((ulong)piVar3->internal_ & 2) == 0) {
              pstore::index::details::internal_node::read_node
                        ((internal_node *)local_298,db,
                         (typed_address<pstore::index::details::internal_node>)
                         ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
              local_2d8._16_8_ = *(index_pointer *)(local_298._0_8_ + 8);
              local_2b8.addr_.a_._0_4_ = 0x20;
              testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                        ((internal *)local_338,"level5_internal->get_bitmap ()","0b100000U",
                         (unsigned_long *)(local_2d8 + 0x10),(uint *)&local_2b8);
              if (local_338[0] == (internal)0x0) {
                testing::Message::Message((Message *)(local_2d8 + 0x10));
                if ((undefined8 *)CONCAT71(local_330._1_7_,local_330[0]) == (undefined8 *)0x0) {
                  pcVar5 = "";
                }
                else {
                  pcVar5 = *(char **)CONCAT71(local_330._1_7_,local_330[0]);
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_2b8.addr_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                           ,0x40d,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_2b8.addr_,(Message *)(local_2d8 + 0x10));
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8.addr_);
                if ((internal_node *)local_2d8._16_8_ != (internal_node *)0x0) {
                  (**(code **)(*(long *)((signature_type *)local_2d8._16_8_)->_M_elems + 8))();
                }
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT71(local_330._1_7_,local_330[0]) !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()(local_330,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT71(local_330._1_7_,local_330[0]));
              }
              piVar3 = pstore::index::details::internal_node::operator[]
                                 ((internal_node *)local_298._0_8_,0);
              if (((ulong)piVar3->internal_ & 2) == 0) {
                pstore::index::details::internal_node::read_node
                          ((internal_node *)(local_2d8 + 0x10),db,
                           (typed_address<pstore::index::details::internal_node>)
                           ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
                piVar3 = pstore::index::details::internal_node::operator[]
                                   ((internal_node *)local_2d8._16_8_,0);
                if (((ulong)piVar3->internal_ & 2) == 0) {
                  pstore::index::details::internal_node::read_node
                            ((internal_node *)&local_2b8.addr_,db,
                             (typed_address<pstore::index::details::internal_node>)
                             ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
                  piVar3 = pstore::index::details::internal_node::operator[]
                                     ((internal_node *)
                                      CONCAT44(local_2b8.addr_.a_._4_4_,local_2b8.addr_.a_._0_4_),0)
                  ;
                  if (((ulong)piVar3->internal_ & 2) == 0) {
                    pstore::index::details::internal_node::read_node
                              ((internal_node *)local_278,db,
                               (typed_address<pstore::index::details::internal_node>)
                               ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
                    piVar3 = pstore::index::details::internal_node::operator[]
                                       ((internal_node *)local_278._0_8_,0);
                    if (((ulong)piVar3->internal_ & 2) == 0) {
                      pstore::index::details::internal_node::read_node
                                ((internal_node *)(local_298 + 0x10),db,
                                 (typed_address<pstore::index::details::internal_node>)
                                 ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
                      piVar3 = pstore::index::details::internal_node::operator[]
                                         ((internal_node *)local_298._16_8_,0);
                      if (((ulong)piVar3->internal_ & 2) == 0) {
                        pstore::index::details::internal_node::read_node
                                  ((internal_node *)&local_2a8.addr_,db,
                                   (typed_address<pstore::index::details::internal_node>)
                                   ((ulong)piVar3->internal_ & 0xfffffffffffffffc));
                        local_2f0 = (index_pointer)(local_2a8.internal_)->bitmap_;
                        local_308.addr_.a_._0_4_ = 0x9000;
                        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                                  ((internal *)local_338,"level10_internal->get_bitmap ()",
                                   "0b10010000\'00000000U",(unsigned_long *)&local_2f0,
                                   (uint *)(local_318 + 0x10));
                        if (local_338[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_2f0.addr_);
                          if ((undefined8 *)CONCAT71(local_330._1_7_,local_330[0]) ==
                              (undefined8 *)0x0) {
                            pcVar5 = "";
                          }
                          else {
                            pcVar5 = *(char **)CONCAT71(local_330._1_7_,local_330[0]);
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)(local_318 + 0x10),kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                                     ,0x41d,pcVar5);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)(local_318 + 0x10),(Message *)&local_2f0.addr_)
                          ;
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)(local_318 + 0x10));
                          if (local_2f0.internal_ != (internal_node *)0x0) {
                            (**(code **)(*(long *)((local_2f0.internal_)->signature_)._M_elems + 8))
                                      ();
                          }
                        }
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT71(local_330._1_7_,local_330[0]) !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()(local_330,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT71(local_330._1_7_,local_330[0]));
                        }
                        iVar4.internal_ = (internal_node *)0x0;
                        piVar3 = pstore::index::details::internal_node::operator[]
                                           (local_2a8.internal_,0);
                        anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_leaf_node
                                  ((GenericIndexFixture *)piVar3->internal_,iVar4);
                        iVar4 = (index_pointer)0x1;
                        piVar3 = pstore::index::details::internal_node::operator[]
                                           (local_2a8.internal_,1);
                        anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_leaf_node
                                  ((GenericIndexFixture *)piVar3->internal_,iVar4);
                        ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
                                 super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                                 ._M_head_impl;
                        local_338 = (undefined1  [8])&local_328;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"e","");
                        bVar2 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                                          ((GenericIndexFixture *)this,ptVar1,(string *)local_338);
                        local_2f0.addr_.a_._0_1_ = bVar2;
                        local_2e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0;
                        if (local_338 != (undefined1  [8])&local_328) {
                          operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
                        }
                        if (local_2f0.addr_.a_._0_1_ == '\0') {
                          testing::Message::Message((Message *)(local_318 + 0x10));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     (CONCAT44(local_308.addr_.a_._4_4_,local_308.addr_.a_._0_4_) +
                                     0x10),"key \"e\" should be present in the index",0x26);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_338,(internal *)&local_2f0.addr_,
                                     (AssertionResult *)"this->is_found (*index_, \"e\")","false",
                                     "true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_2e0,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                                     ,0x420,(char *)local_338);
                          testing::internal::AssertHelper::operator=
                                    (&local_2e0,(Message *)(local_318 + 0x10));
                          testing::internal::AssertHelper::~AssertHelper(&local_2e0);
                          if (local_338 != (undefined1  [8])&local_328) {
                            operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
                          }
                          if ((long *)CONCAT44(local_308.addr_.a_._4_4_,local_308.addr_.a_._0_4_) !=
                              (long *)0x0) {
                            (**(code **)(*(long *)CONCAT44(local_308.addr_.a_._4_4_,
                                                           local_308.addr_.a_._0_4_) + 8))();
                          }
                        }
                        if (local_2e8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_2e8,local_2e8);
                        }
                        ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
                                 super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                                 ._M_head_impl;
                        local_338 = (undefined1  [8])&local_328;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"f","");
                        bVar2 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                                          ((GenericIndexFixture *)this,ptVar1,(string *)local_338);
                        local_2f0.addr_.a_._0_1_ = bVar2;
                        local_2e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0;
                        if (local_338 != (undefined1  [8])&local_328) {
                          operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
                        }
                        if (local_2f0.addr_.a_._0_1_ == '\0') {
                          testing::Message::Message((Message *)(local_318 + 0x10));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     (CONCAT44(local_308.addr_.a_._4_4_,local_308.addr_.a_._0_4_) +
                                     0x10),"key \"f\" should be present in the index",0x26);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_338,(internal *)&local_2f0.addr_,
                                     (AssertionResult *)"this->is_found (*index_, \"f\")","false",
                                     "true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_2e0,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                                     ,0x421,(char *)local_338);
                          testing::internal::AssertHelper::operator=
                                    (&local_2e0,(Message *)(local_318 + 0x10));
                          testing::internal::AssertHelper::~AssertHelper(&local_2e0);
                          if (local_338 != (undefined1  [8])&local_328) {
                            operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
                          }
                          if ((long *)CONCAT44(local_308.addr_.a_._4_4_,local_308.addr_.a_._0_4_) !=
                              (long *)0x0) {
                            (**(code **)(*(long *)CONCAT44(local_308.addr_.a_._4_4_,
                                                           local_308.addr_.a_._0_4_) + 8))();
                          }
                        }
                        if (local_2e8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_2e8,local_2e8);
                        }
                        if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
                        }
                        if (local_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280);
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_
                                    );
                        }
                        if (local_2b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0);
                        }
                        if (local_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c0);
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_
                                    );
                        }
                        if (local_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260);
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_
                                    );
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_
                                    );
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._8_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._8_8_
                                    );
                        }
                        if (local_310.internal_ != (internal_node *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_310.internal_);
                        }
                        local_248.super_transaction_base._vptr_transaction_base =
                             (_func_int **)&PTR__transaction_00271290;
                        pstore::transaction_base::rollback((transaction_base *)(local_258 + 0x10));
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("is_address ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LeafLevelTenCollision) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});

    // First insert_or_assign should be very conventional. The result will be a trie whose root
    // points to an address of the "first" string. Second insert_or_assign should trigger the
    // insertion of an additional internal node in the trie. This unit test checks the
    // insert_into_leaf function.
    //
    //              +--------+
    // root_ ->     | 000000 |       (hash bits 0-5)
    //              +--------+
    //                   |
    //                   v
    //              +--------+
    // level1 ->    | 000001 |       (hash bits 6-11)
    //              +--------+
    //                   |
    //                   :
    //                   |
    //                   v
    //              +--------+
    // level9 ->    | 001001 |       (hash bits 54-59)
    //              +--------+
    //                   |
    //                   v
    //           +--------+--------+
    // level10-> | 001100 | 001111 |  (hash bits 60-63)
    //           +--------+--------+
    //                |       |
    //                v       |
    //               "e"      v       (0b1100 001001 001000 000111 000110 000101 000100 000011
    //               000010 000001 000000)
    //                       "f"      (0b1111 001001 001000 000111 000110 000101 000100 000011
    //                       000010 000001 000000)

    this->insert_or_assign (*index_, t1, "e");
    this->insert_or_assign (*index_, t1, "f");

    EXPECT_TRUE (this->is_found (*index_, "e")) << "key \"e\" should be present in the index";
    EXPECT_TRUE (this->is_found (*index_, "f")) << "key \"f\" should be present in the index";
    {
        // Check that the trie was laid out as we expected in the heap.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b1U);

        auto const level1_internal = (*root_internal)[0].untag<internal_node *> ();
        auto const level2_internal = (*level1_internal)[0].untag<internal_node *> ();
        auto const level3_internal = (*level2_internal)[0].untag<internal_node *> ();
        auto const level4_internal = (*level3_internal)[0].untag<internal_node *> ();
        auto const level5_internal = (*level4_internal)[0].untag<internal_node *> ();
        EXPECT_EQ (level5_internal->get_bitmap (), 0b100000U);

        auto const level6_internal = (*level5_internal)[0].untag<internal_node *> ();
        auto const level7_internal = (*level6_internal)[0].untag<internal_node *> ();
        auto const level8_internal = (*level7_internal)[0].untag<internal_node *> ();
        auto const level9_internal = (*level8_internal)[0].untag<internal_node *> ();
        auto const level10_internal = (*level9_internal)[0].untag<internal_node *> ();
        EXPECT_EQ (level10_internal->get_bitmap (), 0b1001000000000000U);

        this->check_is_leaf_node ((*level10_internal)[0]);
        this->check_is_leaf_node ((*level10_internal)[1]);
        index_->flush (t1, db_.get_current_revision ());
    }
    {
        // Check that the trie was laid out as we expected in the store.
        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);
        auto const root_internal =
            internal_node::read_node (db_, root.untag_address<internal_node> ());
        auto const level1 = (*root_internal)[0];
        auto const level1_internal =
            internal_node::read_node (db_, level1.untag_address<internal_node> ());
        auto const level2 = (*level1_internal)[0];
        auto const level2_internal =
            internal_node::read_node (db_, level2.untag_address<internal_node> ());
        auto const level3 = (*level2_internal)[0];
        auto const level3_internal =
            internal_node::read_node (db_, level3.untag_address<internal_node> ());
        auto const level4 = (*level3_internal)[0];
        auto const level4_internal =
            internal_node::read_node (db_, level4.untag_address<internal_node> ());
        auto const level5 = (*level4_internal)[0];
        auto const level5_internal =
            internal_node::read_node (db_, level5.untag_address<internal_node> ());
        EXPECT_EQ (level5_internal->get_bitmap (), 0b100000U);
        auto const level6 = (*level5_internal)[0];
        auto const level6_internal =
            internal_node::read_node (db_, level6.untag_address<internal_node> ());
        auto const level7 = (*level6_internal)[0];
        auto const level7_internal =
            internal_node::read_node (db_, level7.untag_address<internal_node> ());
        auto const level8 = (*level7_internal)[0];
        auto const level8_internal =
            internal_node::read_node (db_, level8.untag_address<internal_node> ());
        auto const level9 = (*level8_internal)[0];
        auto const level9_internal =
            internal_node::read_node (db_, level9.untag_address<internal_node> ());
        auto const level10 = (*level9_internal)[0];
        auto const level10_internal =
            internal_node::read_node (db_, level10.untag_address<internal_node> ());
        EXPECT_EQ (level10_internal->get_bitmap (), 0b10010000'00000000U);
        this->check_is_leaf_node ((*level10_internal)[0]);
        this->check_is_leaf_node ((*level10_internal)[1]);
        EXPECT_TRUE (this->is_found (*index_, "e")) << "key \"e\" should be present in the index";
        EXPECT_TRUE (this->is_found (*index_, "f")) << "key \"f\" should be present in the index";
    }
}